

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Thread.cpp
# Opt level: O2

void * Thread::localStart(void *arg)

{
  bool bVar1;
  SharedPtr loop;
  EventLoop *local_48;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_40;
  __shared_ptr<EventLoop,_(__gnu_cxx::_Lock_policy)2> local_38;
  _Bind<void_(Thread::*(Thread_*))()> local_28;
  
  (**(code **)(*arg + 0x10))();
  EventLoop::cleanupLocalEventLoop();
  bVar1 = isAutoDelete((Thread *)arg);
  if (bVar1) {
    std::__shared_ptr<EventLoop,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
              (&local_38,(long)arg + 0x48);
    local_28._M_bound_args.super__Tuple_impl<0UL,_Thread_*>.super__Head_base<0UL,_Thread_*,_false>.
    _M_head_impl = (_Tuple_impl<0UL,_Thread_*>)(_Tuple_impl<0UL,_Thread_*>)arg;
    if (local_38._M_ptr == (EventLoop *)0x0) {
      EventLoop::mainEventLoop();
      local_28._M_f = (offset_in_Thread_to_subr)finish;
      local_28._8_8_ = 0;
      EventLoop::callLater<std::_Bind<void(Thread::*(Thread*))()>>(local_48,&local_28);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_40);
    }
    else {
      local_28._M_f = (offset_in_Thread_to_subr)finish;
      local_28._8_8_ = 0;
      EventLoop::callLater<std::_Bind<void(Thread::*(Thread*))()>>(local_38._M_ptr,&local_28);
    }
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_38._M_refcount);
  }
  return (void *)0x0;
}

Assistant:

void* Thread::localStart(void* arg)
{
    Thread* t = static_cast<Thread*>(arg);
    t->run();
    EventLoop::cleanupLocalEventLoop();
    if (t->isAutoDelete()) {
        if (EventLoop::SharedPtr loop = t->mLoop.lock())
            loop->callLater(std::bind(&Thread::finish, t));
        else
            EventLoop::mainEventLoop()->callLater(std::bind(&Thread::finish, t));
    }
    return 0;
}